

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_checkstack(lua_State *L,int n)

{
  CallInfo *pCVar1;
  CallInfo *ci;
  int res;
  int n_local;
  lua_State *L_local;
  
  pCVar1 = L->ci;
  if ((long)n < (long)(L->stack_last).p - (L->top).offset >> 4) {
    ci._0_4_ = 1;
  }
  else {
    ci._0_4_ = luaD_growstack(L,n,0);
  }
  if (((int)ci != 0) && ((pCVar1->top).p < (L->top).p + n)) {
    (pCVar1->top).p = (L->top).p + n;
  }
  return (int)ci;
}

Assistant:

LUA_API int lua_checkstack (lua_State *L, int n) {
  int res;
  CallInfo *ci;
  lua_lock(L);
  ci = L->ci;
  api_check(L, n >= 0, "negative 'n'");
  if (L->stack_last.p - L->top.p > n)  /* stack large enough? */
    res = 1;  /* yes; check is OK */
  else  /* need to grow stack */
    res = luaD_growstack(L, n, 0);
  if (res && ci->top.p < L->top.p + n)
    ci->top.p = L->top.p + n;  /* adjust frame top */
  lua_unlock(L);
  return res;
}